

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionAlgorithmsBullet.cpp
# Opt level: O2

void __thiscall
chrono::collision::cbtCapsuleBoxCollisionAlgorithm::getAllContactManifolds
          (cbtCapsuleBoxCollisionAlgorithm *this,cbtManifoldArray *manifoldArray)

{
  if ((this->m_manifoldPtr != (cbtPersistentManifold *)0x0) && (this->m_ownManifold == true)) {
    cbtAlignedObjectArray<cbtPersistentManifold_*>::push_back(manifoldArray,&this->m_manifoldPtr);
    return;
  }
  return;
}

Assistant:

void cbtCapsuleBoxCollisionAlgorithm::getAllContactManifolds(cbtManifoldArray& manifoldArray) {
    if (m_manifoldPtr && m_ownManifold) {
        manifoldArray.push_back(m_manifoldPtr);
    }
}